

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtrclient.c
# Opt level: O3

void update_spki(spki_table *s,spki_record record,_Bool added)

{
  long lVar1;
  rtr_socket *prVar2;
  char cVar3;
  long lVar4;
  long in_FS_OFFSET;
  
  prVar2 = record.socket;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((print_all_spki_updates) || (*(char *)((long)&record.socket[1].pfx_table + 5) == '\x01')) {
    pthread_mutex_lock((pthread_mutex_t *)&stdout_mutex);
    printf("%c ",(ulong)((uint)!added * 2 + 0x2b));
    printf("HOST:  %s:%s\n",prVar2[1].connection_state_fp,prVar2[1].connection_state_fp_param_config
          );
    printf("ASN:  %u\n  ",(ulong)record.asn);
    printf("SKI:  ");
    printf("%02x",(ulong)record.ski[0]);
    lVar4 = 1;
    do {
      putchar(0x3a);
      printf("%02x",(ulong)record.ski[lVar4]);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x14);
    cVar3 = '\0';
    printf("\n  ");
    printf("SPKI: ");
    lVar4 = 0;
    while( true ) {
      if ((lVar4 != 0) &&
         ((byte)(((byte)(((uint)lVar4 & 0xff) / 5) & 0xf8) * '\x05' + cVar3) == '\0')) {
        printf("\n\t");
      }
      printf("%02x",(ulong)record.spki[lVar4]);
      if (lVar4 == 0x5a) break;
      putchar(0x3a);
      lVar4 = lVar4 + 1;
      cVar3 = cVar3 + -1;
    }
    putchar(10);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pthread_mutex_unlock((pthread_mutex_t *)&stdout_mutex);
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void update_spki(struct spki_table *s __attribute__((unused)), const struct spki_record record, const bool added)
{
	const struct socket_config *config = (const struct socket_config *)record.socket;

	if (!print_all_spki_updates && !config->print_spki_updates)
		return;

	pthread_mutex_lock(&stdout_mutex);

	char c = added ? '+' : '-';

	printf("%c ", c);
	printf("HOST:  %s:%s\n", config->host, config->port);
	printf("ASN:  %u\n  ", record.asn);

	int i;
	int size = sizeof(record.ski);

	printf("SKI:  ");
	for (i = 0; i < size; i++) {
		printf("%02x", record.ski[i]);
		if (i < size - 1)
			printf(":");
	}
	printf("\n  ");

	i = 0;
	size = sizeof(record.spki);
	printf("SPKI: ");
	for (i = 0; i < size; i++) {
		if ((i % 40 == 0) && (i != 0))
			printf("\n	");

		printf("%02x", record.spki[i]);
		if (i < size - 1)
			printf(":");
	}
	printf("\n");

	pthread_mutex_unlock(&stdout_mutex);
}